

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

_Bool trans_RBIT(DisasContext_conflict1 *s,arg_rpr_esz *a)

{
  _Bool _Var1;
  arg_rpr_esz *a_local;
  DisasContext_conflict1 *s_local;
  
  _Var1 = do_zpz_ool(s,a,trans_RBIT::fns[a->esz]);
  return _Var1;
}

Assistant:

static bool trans_RBIT(DisasContext *s, arg_rr *a)
{
    if (!ENABLE_ARCH_6T2) {
        return false;
    }
    return op_rr(s, a, gen_helper_rbit);
}